

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::computeVertexReference
          (ShaderRenderCaseInstance *this,Surface *result,QuadGrid *quadGrid)

{
  float *b;
  Vec4 *pVVar1;
  Vec4 *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  reference pvVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float s;
  float s_00;
  float *local_480;
  RGBA local_42c;
  Vector<float,_4> local_428;
  Vector<float,_4> local_418;
  Vector<float,_4> local_408;
  Vector<float,_4> local_3f8;
  Vector<float,_4> local_3e8;
  undefined1 local_3d8 [8];
  Vec4 color_1;
  Vec4 *t2;
  Vec4 *t1;
  Vec4 *t0;
  float ty;
  float tx;
  bool tri;
  float fy1;
  float fx1;
  float sfy;
  float sfx;
  int ix;
  int iy;
  Vec4 c11;
  Vec4 c10;
  Vec4 c01;
  Vec4 c00;
  int v11;
  int v10;
  int v01;
  int v00;
  int iy1;
  int iy0;
  int ix1;
  int ix0;
  float oosy;
  float oosx;
  float sy1;
  float sy0;
  float sx1;
  float sx0;
  float y1;
  float y0;
  float x1;
  float x0;
  int x_1;
  int y_1;
  Vec4 color;
  int vtxNdx;
  float sy;
  float sx;
  int x;
  int y;
  allocator<tcu::Vector<float,_4>_> local_2c1;
  undefined1 local_2c0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  ShaderEvalContext evalCtx;
  bool hasAlpha;
  int stride;
  int gridSize;
  int height;
  int width;
  QuadGrid *quadGrid_local;
  Surface *result_local;
  ShaderRenderCaseInstance *this_local;
  
  iVar3 = tcu::Surface::getWidth(result);
  iVar4 = tcu::Surface::getHeight(result);
  iVar5 = QuadGrid::getGridSize(quadGrid);
  iVar6 = iVar5 + 1;
  evalCtx.m_quadGrid._7_1_ = 1;
  ShaderEvalContext::ShaderEvalContext
            ((ShaderEvalContext *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,quadGrid);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_2c1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2c0,
             (long)((iVar5 + 1) * (iVar5 + 1)),&local_2c1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_2c1);
  for (sx = 0.0; (int)sx < iVar5 + 1; sx = (float)((int)sx + 1)) {
    for (sy = 0.0; (int)sy < iVar5 + 1; sy = (float)((int)sy + 1)) {
      color.m_data[3] = (float)(int)sx / (float)iVar5;
      color.m_data[2] = (float)((int)sx * (iVar5 + 1) + (int)sy);
      ShaderEvalContext::reset
                ((ShaderEvalContext *)
                 &colors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(float)(int)sy / (float)iVar5,
                 color.m_data[3]);
      (*this->m_evaluator->_vptr_ShaderEvaluator[2])
                (this->m_evaluator,
                 &colors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&x_1,(Vector<float,_4> *)&evalCtx.textures[3].texCubeArray);
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_2c0,(long)(int)color.m_data[2]);
      *(undefined8 *)pvVar10->m_data = _x_1;
      *(undefined8 *)(pvVar10->m_data + 2) = color.m_data._0_8_;
    }
  }
  for (x0 = 0.0; (int)x0 < iVar5; x0 = (float)((int)x0 + 1)) {
    for (x1 = 0.0; (int)x1 < iVar5; x1 = (float)((int)x1 + 1)) {
      fVar11 = ((float)(int)x1 / (float)iVar5) * (float)iVar3;
      fVar12 = ((float)((int)x1 + 1) / (float)iVar5) * (float)iVar3;
      fVar13 = ((float)(int)x0 / (float)iVar5) * (float)iVar4;
      fVar14 = ((float)((int)x0 + 1) / (float)iVar5) * (float)iVar4;
      fVar7 = (float)deCeilFloatToInt32(fVar11 + -0.5);
      dVar8 = deCeilFloatToInt32(fVar12 + -0.5);
      sfx = (float)deCeilFloatToInt32(fVar13 + -0.5);
      dVar9 = deCeilFloatToInt32(fVar14 + -0.5);
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_2c0,(long)((int)x0 * iVar6 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c01.m_data + 2),pvVar10);
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_2c0,(long)((int)x0 * iVar6 + 1 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c10.m_data + 2),pvVar10);
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_2c0,(long)(((int)x0 + 1) * iVar6 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c11.m_data + 2),pvVar10);
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_2c0,(long)(((int)x0 + 1) * iVar6 + 1 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&ix,pvVar10);
      for (; sfy = fVar7, (int)sfx < dVar9; sfx = (float)((int)sfx + 1)) {
        for (; (int)sfy < dVar8; sfy = (float)((int)sfy + 1)) {
          s = deFloatClamp((((float)(int)sfy + 0.5) - fVar11) * (1.0 / (fVar12 - fVar11)),0.0,1.0);
          s_00 = deFloatClamp((((float)(int)sfx + 0.5) - fVar13) * (1.0 / (fVar14 - fVar13)),0.0,1.0
                             );
          if (1.0 < s + s_00) {
            s = 1.0 - s;
            s_00 = 1.0 - s_00;
            b = (float *)&ix;
            pVVar1 = &c11;
            pVVar2 = &c10;
          }
          else {
            b = c01.m_data + 2;
            pVVar1 = &c10;
            pVVar2 = &c11;
          }
          local_480 = pVVar2->m_data + 2;
          color_1.m_data._8_8_ = local_480;
          tcu::operator-((tcu *)&local_408,(Vector<float,_4> *)(pVVar1->m_data + 2),
                         (Vector<float,_4> *)b);
          tcu::operator*((tcu *)&local_3f8,&local_408,s);
          tcu::operator+((tcu *)&local_3e8,(Vector<float,_4> *)b,&local_3f8);
          tcu::operator-((tcu *)&local_428,(Vector<float,_4> *)color_1.m_data._8_8_,
                         (Vector<float,_4> *)b);
          tcu::operator*((tcu *)&local_418,&local_428,s_00);
          tcu::operator+((tcu *)local_3d8,&local_3e8,&local_418);
          tcu::RGBA::RGBA(&local_42c,(Vec4 *)local_3d8);
          tcu::Surface::setPixel(result,(int)sfy,(int)sfx,local_42c);
        }
      }
    }
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2c0);
  ShaderEvalContext::~ShaderEvalContext
            ((ShaderEvalContext *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ShaderRenderCaseInstance::computeVertexReference (tcu::Surface& result, const QuadGrid& quadGrid)
{
	DE_ASSERT(m_evaluator);

	// Buffer info.
	const int				width		= result.getWidth();
	const int				height		= result.getHeight();
	const int				gridSize	= quadGrid.getGridSize();
	const int				stride		= gridSize + 1;
	const bool				hasAlpha	= true; // \todo [2015-09-07 elecro] add correct alpha check
	ShaderEvalContext		evalCtx		(quadGrid);

	// Evaluate color for each vertex.
	std::vector<tcu::Vec4>	colors		((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		const float	sx			= (float)x / (float)gridSize;
		const float	sy			= (float)y / (float)gridSize;
		const int	vtxNdx		= ((y * (gridSize+1)) + x);

		evalCtx.reset(sx, sy);
		m_evaluator->evaluate(evalCtx);
		DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
		tcu::Vec4 color = evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		colors[vtxNdx] = color;
	}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		const float		x0		= (float)x       / (float)gridSize;
		const float		x1		= (float)(x + 1) / (float)gridSize;
		const float		y0		= (float)y       / (float)gridSize;
		const float		y1		= (float)(y + 1) / (float)gridSize;

		const float		sx0		= x0 * (float)width;
		const float		sx1		= x1 * (float)width;
		const float		sy0		= y0 * (float)height;
		const float		sy1		= y1 * (float)height;
		const float		oosx	= 1.0f / (sx1 - sx0);
		const float		oosy	= 1.0f / (sy1 - sy0);

		const int		ix0		= deCeilFloatToInt32(sx0 - 0.5f);
		const int		ix1		= deCeilFloatToInt32(sx1 - 0.5f);
		const int		iy0		= deCeilFloatToInt32(sy0 - 0.5f);
		const int		iy1		= deCeilFloatToInt32(sy1 - 0.5f);

		const int		v00		= (y * stride) + x;
		const int		v01		= (y * stride) + x + 1;
		const int		v10		= ((y + 1) * stride) + x;
		const int		v11		= ((y + 1) * stride) + x + 1;
		const tcu::Vec4	c00		= colors[v00];
		const tcu::Vec4	c01		= colors[v01];
		const tcu::Vec4	c10		= colors[v10];
		const tcu::Vec4	c11		= colors[v11];

		//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

		for (int iy = iy0; iy < iy1; iy++)
		for (int ix = ix0; ix < ix1; ix++)
		{
			DE_ASSERT(deInBounds32(ix, 0, width));
			DE_ASSERT(deInBounds32(iy, 0, height));

			const float			sfx		= (float)ix + 0.5f;
			const float			sfy		= (float)iy + 0.5f;
			const float			fx1		= deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
			const float			fy1		= deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

			// Triangle quad interpolation.
			const bool			tri		= fx1 + fy1 <= 1.0f;
			const float			tx		= tri ? fx1 : (1.0f-fx1);
			const float			ty		= tri ? fy1 : (1.0f-fy1);
			const tcu::Vec4&	t0		= tri ? c00 : c11;
			const tcu::Vec4&	t1		= tri ? c01 : c10;
			const tcu::Vec4&	t2		= tri ? c10 : c01;
			const tcu::Vec4		color	= t0 + (t1-t0)*tx + (t2-t0)*ty;

			result.setPixel(ix, iy, tcu::RGBA(color));
		}
	}
}